

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_std::tuple<solitaire::graphics::TextureId,_unsigned_char>_&>::
~MatcherBase(MatcherBase<const_std::tuple<solitaire::graphics::TextureId,_unsigned_char>_&> *this)

{
  MatcherBase<const_std::tuple<solitaire::graphics::TextureId,_unsigned_char>_&> *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }